

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutual_info.c
# Opt level: O1

double inform_mutual_info(int *series,size_t l,size_t n,int *b,inform_error *err)

{
  uint32_t *puVar1;
  bool bVar2;
  _Bool _Var3;
  inform_dist **marginals;
  inform_dist *piVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  
  _Var3 = check_arguments(series,l,n,b,err);
  if (!_Var3) {
    marginals = (inform_dist **)malloc(l * 8);
    if (marginals == (inform_dist **)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
    }
    else {
      bVar11 = l != 0;
      if (l == 0) {
        sVar5 = 1;
      }
      else {
        sVar5 = (size_t)*b;
        piVar4 = inform_dist_alloc(sVar5);
        *marginals = piVar4;
        if (piVar4 == (inform_dist *)0x0) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          do {
            if (l - 1 == uVar9) {
              bVar11 = false;
              goto LAB_00105231;
            }
            sVar5 = sVar5 * (long)b[uVar9 + 1];
            piVar4 = inform_dist_alloc((long)b[uVar9 + 1]);
            marginals[uVar9 + 1] = piVar4;
            uVar9 = uVar9 + 1;
          } while (piVar4 != (inform_dist *)0x0);
          bVar11 = uVar9 < l;
        }
        if (uVar9 != 0) {
          uVar10 = 0;
          do {
            inform_dist_free(marginals[uVar10]);
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
      }
LAB_00105231:
      bVar2 = true;
      if (bVar11) {
        piVar4 = (inform_dist *)0x0;
      }
      else {
        piVar4 = inform_dist_alloc(sVar5);
        if (piVar4 == (inform_dist *)0x0) {
          if (l != 0) {
            sVar5 = 0;
            do {
              inform_dist_free(marginals[sVar5]);
              sVar5 = sVar5 + 1;
            } while (l != sVar5);
          }
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
        }
        else {
          bVar2 = false;
        }
      }
      if (!bVar2) {
        piVar4->counts = n;
        if (l != 0) {
          sVar5 = 0;
          do {
            marginals[sVar5]->counts = n;
            sVar5 = sVar5 + 1;
          } while (l != sVar5);
        }
        if (n != 0) {
          puVar1 = piVar4->histogram;
          sVar5 = 0;
          do {
            if (l == 0) {
              lVar8 = 0;
            }
            else {
              sVar7 = 0;
              lVar8 = 0;
              piVar6 = series;
              do {
                lVar8 = b[sVar7] * lVar8 + (long)*piVar6;
                marginals[sVar7]->histogram[*piVar6] = marginals[sVar7]->histogram[*piVar6] + 1;
                sVar7 = sVar7 + 1;
                piVar6 = piVar6 + n;
              } while (l != sVar7);
            }
            puVar1[lVar8] = puVar1[lVar8] + 1;
            sVar5 = sVar5 + 1;
            series = series + 1;
          } while (sVar5 != n);
        }
        dVar12 = inform_shannon_multi_mi(piVar4,marginals,l,2.0);
        inform_dist_free(piVar4);
        if (l != 0) {
          sVar5 = 0;
          do {
            inform_dist_free(marginals[sVar5]);
            sVar5 = sVar5 + 1;
          } while (l != sVar5);
        }
        free(marginals);
        return dVar12;
      }
      free(marginals);
    }
  }
  return NAN;
}

Assistant:

double inform_mutual_info(int const *series, size_t l, size_t n, int const *b,
    inform_error *err)
{
    if (check_arguments(series, l, n, b, err)) return NAN;

    inform_dist **marginals = malloc(l * sizeof(inform_dist*));
    if (marginals == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }
    inform_dist *joint = NULL;
    if (allocate(b, l, &joint, marginals, err))
    {
        free(marginals);
        return NAN;
    }

    accumulate(series, l, n, b, joint, marginals);

    double mi = inform_shannon_multi_mi(joint, (inform_dist const **)marginals, l, 2.0);

    free_all(&joint, marginals, l);

    return mi;
}